

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O3

void __thiscall
QKeyEvent::QKeyEvent
          (QKeyEvent *this,Type type,int key,KeyboardModifiers modifiers,QString *text,bool autorep,
          quint16 count)

{
  undefined1 *puVar1;
  Data *pDVar2;
  QInputDevice *pQVar3;
  long in_FS_OFFSET;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d.size = 0;
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  pQVar3 = QInputDevice::primaryKeyboard(&local_58);
  QEvent::QEvent((QEvent *)this,type);
  puVar1 = &(this->super_QInputEvent).field_0xf;
  *puVar1 = *puVar1 | 0x20;
  *(undefined ***)&this->super_QInputEvent = &PTR__QContextMenuEvent_007d2f90;
  (this->super_QInputEvent).m_dev = pQVar3;
  (this->super_QInputEvent).m_timeStamp = 0;
  (this->super_QInputEvent).m_modState.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
  super_QFlagsStorage<Qt::KeyboardModifier>.i =
       (Int)modifiers.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
            super_QFlagsStorage<Qt::KeyboardModifier>.i;
  (this->super_QInputEvent).m_reserved = 0;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  *(undefined ***)&this->super_QInputEvent = &PTR__QKeyEvent_007d3158;
  pDVar2 = (text->d).d;
  (this->m_text).d.d = pDVar2;
  (this->m_text).d.ptr = (text->d).ptr;
  (this->m_text).d.size = (text->d).size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this->m_key = key;
  this->m_scanCode = 0;
  this->m_virtualKey = 0;
  this->m_nativeModifiers = 0;
  *(ushort *)&this->field_0x50 = (ushort)autorep << 0xf | count & 0x7fff;
  if (type == ShortcutOverride) {
    (this->super_QInputEvent).field_0xc = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QKeyEvent::QKeyEvent(Type type, int key, Qt::KeyboardModifiers modifiers, const QString& text,
                     bool autorep, quint16 count)
    : QInputEvent(type, QInputDevice::primaryKeyboard(), modifiers), m_text(text), m_key(key),
      m_scanCode(0), m_virtualKey(0), m_nativeModifiers(0),
      m_count(count), m_autoRepeat(autorep)
{
     if (type == QEvent::ShortcutOverride)
        ignore();
}